

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::DeadStoreTypeCheckBailOut(BackwardPass *this,Instr *instr)

{
  Opnd **ppOVar1;
  Opnd **ppOVar2;
  code *pcVar3;
  bool bVar4;
  BailOutKind kind;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  PropertySymOpnd *propertySymOpnd;
  BailOutInfo *pBVar7;
  Opnd **ppOVar8;
  BailOutKind local_38;
  bool local_31;
  BailOutKind bailOutKind;
  bool isTypeCheckProtected;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8e0,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar4) goto LAB_003c93b5;
    *puVar5 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    return;
  }
  if ((instr->m_dst != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsSymOpnd(instr->m_dst), bVar4)) {
    return;
  }
  kind = IR::Instr::GetBailOutKind(instr);
  bVar4 = IR::IsTypeCheckBailOutKind(kind);
  if (!bVar4) {
    return;
  }
  ppOVar1 = &instr->m_dst;
  ppOVar2 = &instr->m_src1;
  if ((instr->m_src1 == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsSymOpnd(instr->m_src1), !bVar4)) {
LAB_003c90ea:
    if ((*ppOVar1 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsSymOpnd(*ppOVar1), bVar4)) {
      pSVar6 = IR::Opnd::AsSymOpnd(*ppOVar1);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
      if (bVar4) goto LAB_003c9164;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8f6,
                       "((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()))"
                       ,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd())"
                      );
    if (!bVar4) goto LAB_003c93b5;
    *puVar5 = 0;
  }
  else {
    pSVar6 = IR::Opnd::AsSymOpnd(*ppOVar2);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
    if (!bVar4) goto LAB_003c90ea;
  }
LAB_003c9164:
  if ((*ppOVar1 == (Opnd *)0x0) ||
     (bVar4 = IR::Opnd::IsSymOpnd(*ppOVar1), ppOVar8 = ppOVar1, !bVar4)) {
    ppOVar8 = ppOVar2;
  }
  propertySymOpnd = IR::Opnd::AsPropertySymOpnd(*ppOVar8);
  if ((char)(propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags < '\0') {
    return;
  }
  local_31 = false;
  bVar4 = GlobOpt::NeedsTypeCheckBailOut
                    (instr,propertySymOpnd,propertySymOpnd == (PropertySymOpnd *)instr->m_dst,
                     &local_31,&local_38);
  if (bVar4) {
    if ((local_38 & ~BailOutNumberOnly) != BailOutFailedFixedFieldTypeCheck &&
        (kind & ~BailOutKindBits) != local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x908,
                         "((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)"
                         ,
                         "(oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck"
                        );
      if (!bVar4) {
LAB_003c93b5:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
LAB_003c922d:
    IR::Instr::SetBailOutKind(instr,local_38);
  }
  else {
    if (local_31 != true) {
      bVar4 = IR::PropertySymOpnd::IsTypeCheckProtected(propertySymOpnd);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x916,"(!propertySymOpnd->IsTypeCheckProtected())",
                           "!propertySymOpnd->IsTypeCheckProtected()");
        if (!bVar4) goto LAB_003c93b5;
        *puVar5 = 0;
      }
      if (instr->m_opcode != CheckObjType) {
        bVar4 = BasicBlock::IsLandingPad(this->currentBlock);
        if (bVar4) {
          if (this->preOpBailOutInstrToProcess == instr) {
            this->preOpBailOutInstrToProcess = (Instr *)0x0;
          }
          IR::Instr::UnlinkBailOutInfo(instr);
          return;
        }
        if (local_38 == BailOutFailedEquivalentTypeCheck) {
          return;
        }
        if (local_38 == BailOutFailedEquivalentFixedFieldTypeCheck) {
          return;
        }
        pBVar7 = IR::Instr::GetBailOutInfo(instr);
        pBVar7->polymorphicCacheIndex = 0xffffffff;
        if ((int)kind < 0) {
          local_38 = kind & BailOutMarkTempObject | (LazyBailOut|BailOutOnImplicitCallsPreOp);
        }
        else {
          local_38 = kind & BailOutMarkTempObject | BailOutOnImplicitCallsPreOp;
        }
        goto LAB_003c922d;
      }
      if (((*ppOVar1 != (Opnd *)0x0) || (*ppOVar2 == (Opnd *)0x0)) || (instr->m_src2 != (Opnd *)0x0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x91d,
                           "(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)"
                           ,
                           "instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr"
                          );
        if (!bVar4) goto LAB_003c93b5;
        *puVar5 = 0;
      }
      instr->m_opcode = Nop;
      IR::Instr::FreeSrc1(instr);
    }
    IR::Instr::ClearBailOutInfo(instr);
    if (this->preOpBailOutInstrToProcess == instr) {
      this->preOpBailOutInstrToProcess = (Instr *)0x0;
    }
  }
  return;
}

Assistant:

void
BackwardPass::DeadStoreTypeCheckBailOut(IR::Instr * instr)
{
    // Good news: There are cases where the forward pass installs BailOutFailedTypeCheck, but the dead store pass
    // discovers that the checked type is dead.
    // Bad news: We may still need implicit call bailout, and it's up to the dead store pass to figure this out.
    // Worse news: BailOutFailedTypeCheck is pre-op, and BailOutOnImplicitCall is post-op. We'll use a special
    // bailout kind to indicate implicit call bailout that targets its own instruction. The lowerer will emit
    // code to disable/re-enable implicit calls around the operation.

    Assert(this->tag == Js::DeadStorePhase);

    if (this->IsPrePass() || !instr->HasBailOutInfo())
    {
        return;
    }

    // By default, do not do this for stores, as it makes the presence of type checks unpredictable in the forward pass.
    // For instance, we can't predict which stores may cause reallocation of aux slots.
    if (instr->GetDst() && instr->GetDst()->IsSymOpnd())
    {
        return;
    }

    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
    if (!IR::IsTypeCheckBailOutKind(oldBailOutKind))
    {
        return;
    }

    // Either src1 or dst must be a property sym operand
    Assert((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) ||
        (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()));

    IR::PropertySymOpnd *propertySymOpnd =
        (instr->GetDst() && instr->GetDst()->IsSymOpnd()) ? instr->GetDst()->AsPropertySymOpnd() : instr->GetSrc1()->AsPropertySymOpnd();

    if (propertySymOpnd->TypeCheckRequired())
    {
        return;
    }

    bool isTypeCheckProtected = false;
    IR::BailOutKind bailOutKind;
    if (GlobOpt::NeedsTypeCheckBailOut(instr, propertySymOpnd, propertySymOpnd == instr->GetDst(), &isTypeCheckProtected, &bailOutKind))
    {
        // If we installed a failed type check bailout in the forward pass, but we are now discovering that the checked
        // type is dead, we may still need a bailout on failed fixed field type check. These type checks are required
        // regardless of whether the checked type is dead.  Hence, the bailout kind may change here.
        Assert((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind ||
            bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck);
        instr->SetBailOutKind(bailOutKind);
        return;
    }
    else if (isTypeCheckProtected)
    {
        instr->ClearBailOutInfo();
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    Assert(!propertySymOpnd->IsTypeCheckProtected());

    // If all we're doing here is checking the type (e.g. because we've hoisted a field load or store out of the loop, but needed
    // the type check to remain in the loop), and now it turns out we don't need the type checked, we can simply turn this into
    // a NOP and remove the bailout.
    if (instr->m_opcode == Js::OpCode::CheckObjType)
    {
        Assert(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr);
        instr->m_opcode = Js::OpCode::Nop;
        instr->FreeSrc1();
        instr->ClearBailOutInfo();
        if (this->preOpBailOutInstrToProcess == instr)
        {
            this->preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    // We don't need BailOutFailedTypeCheck but may need BailOutOnImplicitCall.
    // Consider: are we in the loop landing pad? If so, no bailout, since implicit calls will be checked at
    // the end of the block.
    if (this->currentBlock->IsLandingPad())
    {
        // We're in the landing pad.
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        instr->UnlinkBailOutInfo();
        return;
    }

    // If bailOutKind is equivTypeCheck then leave alone the bailout
    if (bailOutKind == IR::BailOutFailedEquivalentTypeCheck ||
        bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)
    {
        return;
    }

    // We're not checking for polymorphism, so don't let the bailout indicate that we
    // detected polymorphism.
    instr->GetBailOutInfo()->polymorphicCacheIndex = (uint)-1;

    // Keep the mark temp object bit if it is there so that we will not remove the implicit call check
    IR::BailOutKind newBailOutKind = IR::BailOutOnImplicitCallsPreOp | (oldBailOutKind & IR::BailOutMarkTempObject);
    if (BailOutInfo::HasLazyBailOut(oldBailOutKind))
    {
        instr->SetBailOutKind(BailOutInfo::WithLazyBailOut(newBailOutKind));
    }
    else
    {
        instr->SetBailOutKind(newBailOutKind);
    }
}